

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

uint __thiscall IR::Instr::GetAsmJsArgOutSize(Instr *this)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  uint32 lhs;
  StackSym *this_00;
  Opnd *pOVar4;
  IntConstOpnd *pIVar5;
  undefined4 *puVar6;
  Instr *pIStack_20;
  uint size;
  Instr *argInstr;
  Instr *this_local;
  
  OVar1 = this->m_opcode;
  if ((OVar1 == StartCall) || (OVar1 == LoweredStartCall)) {
    pOVar4 = GetSrc2(this);
    pIVar5 = Opnd::AsIntConstOpnd(pOVar4);
    this_local._4_4_ = IntConstOpnd::AsUint32(pIVar5);
  }
  else {
    pIStack_20 = this;
    if (OVar1 == InlineeEnd) {
      while( true ) {
        bVar3 = false;
        if (pIStack_20->m_opcode != StartCall) {
          bVar3 = pIStack_20->m_opcode != LoweredStartCall;
        }
        if (!bVar3) break;
        pOVar4 = GetSrc2(pIStack_20);
        this_00 = Opnd::GetStackSym(pOVar4);
        pIStack_20 = StackSym::GetInstrDef(this_00);
      }
      pOVar4 = GetSrc2(pIStack_20);
      pIVar5 = Opnd::AsIntConstOpnd(pOVar4);
      lhs = IntConstOpnd::AsUint32(pIVar5);
      this_local._4_4_ = UInt32Math::Add(lhs,0x18);
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xe56,"((0))","UNREACHED");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint Instr::GetAsmJsArgOutSize()
{
    switch (m_opcode)
    {
    case Js::OpCode::StartCall:
    case Js::OpCode::LoweredStartCall:
        return GetSrc2()->AsIntConstOpnd()->AsUint32();

    case Js::OpCode::InlineeEnd:
    {
        // StartCall instr has the size, so walk back to it
        IR::Instr *argInstr = this;
        while(argInstr->m_opcode != Js::OpCode::StartCall && argInstr->m_opcode != Js::OpCode::LoweredStartCall)
        {
            argInstr = argInstr->GetSrc2()->GetStackSym()->GetInstrDef();
        }
        // add StartCall arg size with inlinee meta args for full size
        uint size = UInt32Math::Add(argInstr->GetSrc2()->AsIntConstOpnd()->AsUint32(), Js::Constants::InlineeMetaArgCount * MachPtr);
        return size;
    }
    default:
        Assert(UNREACHED);
        return 0;
    }
    }